

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O2

void __thiscall
Clasp::ShortImplicationsGraph::remove_bin(ShortImplicationsGraph *this,ImplicationList *w,Literal p)

{
  buf_type *pbVar1;
  Literal *pLVar2;
  uint uVar3;
  uint32 local_c;
  
  pbVar1 = (w->super_ImpListBase).super_type.
           super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.buf_;
  local_c = p.rep_;
  pLVar2 = std::__find_if<Clasp::Literal*,__gnu_cxx::__ops::_Iter_equals_val<Clasp::Literal_const>>
                     (pbVar1,pbVar1 + (w->super_ImpListBase).super_type.
                                      super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>
                                      .left_,&local_c);
  pbVar1 = (w->super_ImpListBase).super_type.
           super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.buf_;
  uVar3 = (w->super_ImpListBase).super_type.
          super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.left_;
  if ((Literal *)(pbVar1 + uVar3) != pLVar2) {
    uVar3 = uVar3 - 4;
    (w->super_ImpListBase).super_type.
    super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.left_ = uVar3;
    pLVar2->rep_ = *(uint32 *)(pbVar1 + uVar3);
  }
  bk_lib::left_right_sequence<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>,_56U>::
  try_shrink(&w->super_ImpListBase);
  return;
}

Assistant:

void ShortImplicationsGraph::remove_bin(ImplicationList& w, Literal p) {
	w.erase_left_unordered(std::find(w.left_begin(), w.left_end(), p));
	w.try_shrink();
}